

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_object_dotremove_internal(JSON_Object *object,char *name,parson_bool_t free_value)

{
  JSON_Status JVar1;
  char *pcVar2;
  JSON_Value *pJVar3;
  
  while( true ) {
    pcVar2 = strchr(name,0x2e);
    if (pcVar2 == (char *)0x0) {
      JVar1 = json_object_remove_internal(object,name,free_value);
      return JVar1;
    }
    pJVar3 = json_object_getn_value(object,name,(long)pcVar2 - (long)name);
    if ((pJVar3 == (JSON_Value *)0x0) || (pJVar3->type != 4)) break;
    object = (pJVar3->value).object;
    name = pcVar2 + 1;
  }
  return -1;
}

Assistant:

static JSON_Status json_object_dotremove_internal(JSON_Object *object, const char *name, parson_bool_t free_value) {
    JSON_Value *temp_value = NULL;
    JSON_Object *temp_object = NULL;
    const char *dot_pos = strchr(name, '.');
    if (!dot_pos) {
        return json_object_remove_internal(object, name, free_value);
    }
    temp_value = json_object_getn_value(object, name, dot_pos - name);
    if (json_value_get_type(temp_value) != JSONObject) {
        return JSONFailure;
    }
    temp_object = json_value_get_object(temp_value);
    return json_object_dotremove_internal(temp_object, dot_pos + 1, free_value);
}